

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void absl::lts_20250127::base_internal::AddToFreelist(void *v,Arena *arena)

{
  AllocList *e;
  int iVar1;
  AllocList *prev [30];
  
  e = (AllocList *)((long)v + -0x20);
  if ((*(ulong *)((long)v + -0x18) ^ (ulong)e) != 0x4c833e95) {
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1ee,"Check %s failed: %s",
               "f->header.magic == Magic(kMagicAllocated, &f->header)",
               "bad magic number in AddToFreelist()");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                  ,0x1ee,"void absl::base_internal::AddToFreelist(void *, LowLevelAlloc::Arena *)");
  }
  if (*(Arena **)((long)v + -0x10) == arena) {
    iVar1 = LLA_SkiplistLevels(*(size_t *)((long)v + -0x20),arena->min_size,&arena->random);
    *(int *)v = iVar1;
    LLA_SkiplistInsert(&arena->freelist,e,prev);
    *(ulong *)((long)v + -0x18) = (ulong)e ^ 0xffffffffb37cc16a;
    Coalesce(e);
    Coalesce(prev[0]);
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x1f0,"Check %s failed: %s","f->header.arena == arena",
             "bad arena pointer in AddToFreelist()");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x1f0,"void absl::base_internal::AddToFreelist(void *, LowLevelAlloc::Arena *)");
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                               sizeof(f->header));
  ABSL_RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
                 "bad magic number in AddToFreelist()");
  ABSL_RAW_CHECK(f->header.arena == arena,
                 "bad arena pointer in AddToFreelist()");
  f->levels =
      LLA_SkiplistLevels(f->header.size, arena->min_size, &arena->random);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);        // maybe coalesce with successor
  Coalesce(prev[0]);  // maybe coalesce with predecessor
}